

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jquant2.c
# Opt level: O0

int median_cut(j_decompress_ptr cinfo,boxptr boxlist,int numboxes,int desired_colors)

{
  int iVar1;
  int iVar2;
  boxptr boxp;
  boxptr b2;
  boxptr b1;
  int cmax;
  int c2;
  int c1;
  int c0;
  int lb;
  int n;
  int desired_colors_local;
  int numboxes_local;
  boxptr boxlist_local;
  j_decompress_ptr cinfo_local;
  
  n = numboxes;
  while( true ) {
    if (desired_colors <= n) {
      return n;
    }
    if (desired_colors < n * 2) {
      b2 = find_biggest_volume(boxlist,n);
    }
    else {
      b2 = find_biggest_color_pop(boxlist,n);
    }
    if (b2 == (boxptr)0x0) break;
    boxp = boxlist + n;
    boxp->c0max = b2->c0max;
    boxp->c1max = b2->c1max;
    boxp->c2max = b2->c2max;
    boxp->c0min = b2->c0min;
    boxp->c1min = b2->c1min;
    boxp->c2min = b2->c2min;
    iVar1 = (b2->c0max - b2->c0min) * 0x10;
    iVar2 = (b2->c1max - b2->c1min) * 0xc;
    b1._0_4_ = iVar2;
    if (iVar2 < iVar1) {
      b1._0_4_ = iVar1;
    }
    c0 = (int)(iVar2 >= iVar1);
    if ((int)b1 < (b2->c2max - b2->c2min) * 8) {
      c0 = 2;
    }
    if (c0 == 0) {
      iVar1 = (b2->c0max + b2->c0min) / 2;
      b2->c0max = iVar1;
      boxp->c0min = iVar1 + 1;
    }
    else if (c0 == 1) {
      iVar1 = (b2->c1max + b2->c1min) / 2;
      b2->c1max = iVar1;
      boxp->c1min = iVar1 + 1;
    }
    else if (c0 == 2) {
      iVar1 = (b2->c2max + b2->c2min) / 2;
      b2->c2max = iVar1;
      boxp->c2min = iVar1 + 1;
    }
    update_box(cinfo,b2);
    update_box(cinfo,boxp);
    n = n + 1;
  }
  return n;
}

Assistant:

LOCAL(int)
median_cut (j_decompress_ptr cinfo, boxptr boxlist, int numboxes,
	    int desired_colors)
/* Repeatedly select and split the largest box until we have enough boxes */
{
  int n,lb;
  int c0,c1,c2,cmax;
  register boxptr b1,b2;

  while (numboxes < desired_colors) {
    /* Select box to split.
     * Current algorithm: by population for first half, then by volume.
     */
    if (numboxes*2 <= desired_colors) {
      b1 = find_biggest_color_pop(boxlist, numboxes);
    } else {
      b1 = find_biggest_volume(boxlist, numboxes);
    }
    if (b1 == NULL)		/* no splittable boxes left! */
      break;
    b2 = &boxlist[numboxes];	/* where new box will go */
    /* Copy the color bounds to the new box. */
    b2->c0max = b1->c0max; b2->c1max = b1->c1max; b2->c2max = b1->c2max;
    b2->c0min = b1->c0min; b2->c1min = b1->c1min; b2->c2min = b1->c2min;
    /* Choose which axis to split the box on.
     * Current algorithm: longest scaled axis.
     * See notes in update_box about scaling distances.
     */
    c0 = ((b1->c0max - b1->c0min) << C0_SHIFT) * C0_SCALE;
    c1 = ((b1->c1max - b1->c1min) << C1_SHIFT) * C1_SCALE;
    c2 = ((b1->c2max - b1->c2min) << C2_SHIFT) * C2_SCALE;
    /* We want to break any ties in favor of green, then red, blue last.
     * This code does the right thing for R,G,B or B,G,R color orders only.
     */
#if RGB_RED == 0
    cmax = c1; n = 1;
    if (c0 > cmax) { cmax = c0; n = 0; }
    if (c2 > cmax) { n = 2; }
#else
    cmax = c1; n = 1;
    if (c2 > cmax) { cmax = c2; n = 2; }
    if (c0 > cmax) { n = 0; }
#endif
    /* Choose split point along selected axis, and update box bounds.
     * Current algorithm: split at halfway point.
     * (Since the box has been shrunk to minimum volume,
     * any split will produce two nonempty subboxes.)
     * Note that lb value is max for lower box, so must be < old max.
     */
    switch (n) {
    case 0:
      lb = (b1->c0max + b1->c0min) / 2;
      b1->c0max = lb;
      b2->c0min = lb+1;
      break;
    case 1:
      lb = (b1->c1max + b1->c1min) / 2;
      b1->c1max = lb;
      b2->c1min = lb+1;
      break;
    case 2:
      lb = (b1->c2max + b1->c2min) / 2;
      b1->c2max = lb;
      b2->c2min = lb+1;
      break;
    }
    /* Update stats for boxes */
    update_box(cinfo, b1);
    update_box(cinfo, b2);
    numboxes++;
  }
  return numboxes;
}